

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O1

int complt(int flags,int c,char *buf,size_t nbuf,int cpos,int *nx)

{
  long lVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  buffer *pbVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  ulong __n;
  ulong uVar13;
  int iVar14;
  char *pcVar15;
  int iVar16;
  buffer *pbVar17;
  buffer *local_40;
  int local_34;
  
  __n = (ulong)cpos;
  if ((flags & 1U) == 0) {
    if ((flags & 2U) == 0) {
      if ((flags & 4U) == 0) {
        panic("broken complt call: flags");
      }
      buf[__n] = '\0';
      pbVar9 = (buffer *)make_file_list(buf);
      local_40 = pbVar9;
    }
    else {
      local_40 = (buffer *)0x0;
      pbVar9 = bheadp;
    }
  }
  else {
    buf[__n] = '\0';
    pbVar9 = (buffer *)complete_function_list(buf);
    local_40 = pbVar9;
  }
  if ((c & 0xfffffffbU) != 9) {
    panic("broken complt call: c");
  }
  if (pbVar9 == (buffer *)0x0) {
    pbVar17 = (buffer *)0x0;
    local_34 = 1000;
    iVar7 = 0;
  }
  else {
    local_34 = 1000;
    iVar7 = 0;
    pbVar17 = (buffer *)0x0;
    do {
      pcVar15 = (pbVar9->b_list).l_name;
      iVar6 = bcmp(buf,pcVar15,__n);
      iVar11 = local_34;
      if (iVar6 == 0) {
        if (iVar7 == 0) {
          pbVar17 = pbVar9;
        }
        iVar7 = iVar7 + 1;
        if (pcVar15[__n] == '\0') {
          local_34 = -1;
          iVar11 = local_34;
        }
        else {
          pcVar3 = (pbVar17->b_list).l_name;
          iVar6 = cpos;
          if (pcVar15[__n] == pcVar3[__n]) {
            lVar10 = 0;
            do {
              lVar5 = lVar10 + __n + 1;
              lVar1 = lVar10 + 1;
              if (pcVar15[lVar5] == '\0') break;
              lVar4 = lVar10 + __n + 1;
              lVar10 = lVar1;
            } while (pcVar15[lVar5] == pcVar3[lVar4]);
            iVar6 = (int)lVar1 + cpos;
          }
          pbVar17 = pbVar9;
          iVar11 = iVar6 - cpos;
          if (local_34 <= iVar6 - cpos) {
            iVar11 = local_34;
          }
        }
      }
      local_34 = iVar11;
      pbVar9 = (buffer *)(pbVar9->b_list).l_p.l_wp;
    } while (pbVar9 != (buffer *)0x0);
  }
  if (iVar7 == 0) {
    pcVar15 = " [No match]";
  }
  else {
    if ((iVar7 < 2) || (local_34 != 0)) {
      if (__n < nbuf && 0 < local_34) {
        iVar7 = 1;
        do {
          uVar13 = __n + 1;
          cVar2 = (pbVar17->b_list).l_name[__n];
          buf[__n] = cVar2;
          eputc(cVar2);
          if (local_34 <= iVar7) break;
          iVar7 = iVar7 + 1;
          __n = uVar13;
        } while (uVar13 < nbuf);
      }
      ttflush();
      free_file_list(&local_40->b_list);
      iVar7 = 0;
      if (0 < local_34) {
        iVar7 = local_34;
      }
      if (c == 0xd) {
        iVar7 = local_34;
      }
      *nx = iVar7;
      return 1;
    }
    pcVar15 = " [Ambiguous. Ctrl-G to cancel]";
  }
  free_file_list(&local_40->b_list);
  sVar8 = strlen(pcVar15);
  iVar6 = ncol;
  iVar11 = ttcol;
  iVar16 = (int)sVar8 + ttcol + 2;
  iVar12 = (ncol - ttcol) + -2;
  if (iVar16 <= ncol) {
    iVar12 = (int)sVar8;
  }
  cVar2 = *pcVar15;
  while (cVar2 != '\0') {
    pcVar15 = pcVar15 + 1;
    eputc(cVar2);
    cVar2 = *pcVar15;
  }
  ttcol = ttcol - iVar12;
  if (iVar12 != 0) {
    iVar14 = iVar16;
    if (iVar6 < iVar16) {
      iVar14 = iVar6;
    }
    iVar14 = (iVar11 - iVar14) + 2;
    do {
      ttputc(8);
      iVar14 = iVar14 + 1;
    } while (iVar14 != 0);
  }
  ttflush();
  if (iVar12 != 0) {
    iVar14 = iVar16;
    if (iVar6 < iVar16) {
      iVar14 = iVar6;
    }
    iVar14 = (iVar11 - iVar14) + 2;
    do {
      eputc(' ');
      iVar14 = iVar14 + 1;
    } while (iVar14 != 0);
  }
  ttcol = ttcol - iVar12;
  if (iVar12 != 0) {
    if (iVar6 < iVar16) {
      iVar16 = iVar6;
    }
    iVar11 = (iVar11 - iVar16) + 2;
    do {
      ttputc(8);
      iVar11 = iVar11 + 1;
    } while (iVar11 != 0);
  }
  *nx = local_34;
  return (uint)(0 < iVar7);
}

Assistant:

static int
complt(int flags, int c, char *buf, size_t nbuf, int cpos, int *nx)
{
	struct list	*lh, *lh2;
	struct list	*wholelist = NULL;
	int	 i, nxtra, nhits, bxtra, msglen, nshown;
	int	 wflag = FALSE;
	char	*msg;

	lh = lh2 = NULL;

	if ((flags & EFFUNC) != 0) {
		buf[cpos] = '\0';
		wholelist = lh = complete_function_list(buf);
	} else if ((flags & EFBUF) != 0) {
		lh = &(bheadp->b_list);
	} else if ((flags & EFFILE) != 0) {
		buf[cpos] = '\0';
		wholelist = lh = make_file_list(buf);
	} else
		panic("broken complt call: flags");

	if (c == ' ')
		wflag = TRUE;
	else if (c != '\t' && c != CCHR('M'))
		panic("broken complt call: c");

	nhits = 0;
	nxtra = HUGE;

	for (; lh != NULL; lh = lh->l_next) {
		if (memcmp(buf, lh->l_name, cpos) != 0)
			continue;
		if (nhits == 0)
			lh2 = lh;
		++nhits;
		if (lh->l_name[cpos] == '\0')
			nxtra = -1; /* exact match */
		else {
			bxtra = getxtra(lh, lh2, cpos, wflag);
			if (bxtra < nxtra)
				nxtra = bxtra;
			lh2 = lh;
		}
	}
	if (nhits == 0)
		msg = " [No match]";
	else if (nhits > 1 && nxtra == 0)
		msg = " [Ambiguous. Ctrl-G to cancel]";
	else {
		/*
		 * Being lazy - ought to check length, but all things
		 * autocompleted have known types/lengths.
		 */
		if (nxtra < 0 && nhits > 1 && c == ' ')
			nxtra = 1; /* ??? */
		for (i = 0; i < nxtra && cpos < nbuf; ++i) {
			buf[cpos] = lh2->l_name[cpos];
			eputc(buf[cpos++]);
		}
		/* XXX should grow nbuf */
		ttflush();
		free_file_list(wholelist);
		*nx = nxtra;
		if (nxtra < 0 && c != CCHR('M')) /* exact */
			*nx = 0;
		return (TRUE);
	}

	/*
	 * wholelist is NULL if we are doing buffers.  Want to free lists
	 * that were created for us, but not the buffer list!
	 */
	free_file_list(wholelist);

	/* Set up backspaces, etc., being mindful of echo line limit. */
	msglen = strlen(msg);
	nshown = (ttcol + msglen + 2 > ncol) ?
		ncol - ttcol - 2 : msglen;
	eputs(msg);
	ttcol -= (i = nshown);	/* update ttcol!		 */
	while (i--)		/* move back before msg		 */
		ttputc('\b');
	ttflush();		/* display to user		 */
	i = nshown;
	while (i--)		/* blank out on next flush	 */
		eputc(' ');
	ttcol -= (i = nshown);	/* update ttcol on BS's		 */
	while (i--)
		ttputc('\b');	/* update ttcol again!		 */
	*nx = nxtra;
	return ((nhits > 0) ? TRUE : FALSE);
}